

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Request::is_multipart_form_data(Request *this)

{
  long lVar1;
  allocator local_59;
  string local_58;
  string local_38;
  string *local_18;
  string *content_type;
  Request *this_local;
  
  content_type = &this->method;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"Content-Type",&local_59);
  get_header_value(&local_38,this,&local_58,0);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_18 = &local_38;
  lVar1 = std::__cxx11::string::rfind((char *)local_18,0x1e9643);
  std::__cxx11::string::~string((string *)&local_38);
  return (bool)((lVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

inline bool Request::is_multipart_form_data() const {
  const auto &content_type = get_header_value("Content-Type");
  return !content_type.rfind("multipart/form-data", 0);
}